

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

bool __thiscall DIntermissionController::NextPage(DIntermissionController *this)

{
  uint uVar1;
  int iVar2;
  FIntermissionDescriptor *this_00;
  bool bVar3;
  uint uVar4;
  FIntermissionAction **ppFVar5;
  DIntermissionScreen *pDVar6;
  FName local_44;
  FIntermissionDescriptor **local_40;
  FIntermissionDescriptor **pDesc;
  FIntermissionAction *local_30;
  FIntermissionAction *action;
  bool local_1d;
  FTextureID local_1c;
  bool fill;
  DIntermissionController *pDStack_18;
  FTextureID bg;
  DIntermissionController *this_local;
  
  pDStack_18 = this;
  FTextureID::FTextureID(&local_1c);
  local_1d = false;
  uVar1 = this->mIndex;
  uVar4 = TArray<FIntermissionAction_*,_FIntermissionAction_*>::Size
                    (&(this->mDesc->mActions).
                      super_TArray<FIntermissionAction_*,_FIntermissionAction_*>);
  if ((uVar1 == uVar4) && (bVar3 = FName::operator==(&this->mDesc->mLink,NAME_None), bVar3)) {
    this_local._7_1_ = false;
  }
  else {
    bVar3 = TObjPtr<DIntermissionScreen>::operator!=(&this->mScreen,(DIntermissionScreen *)0x0);
    if (bVar3) {
      pDVar6 = TObjPtr<DIntermissionScreen>::operator->(&this->mScreen);
      action._4_4_ = DIntermissionScreen::GetBackground(pDVar6,&local_1d);
      local_1c = action._4_4_;
      pDVar6 = TObjPtr<DIntermissionScreen>::operator->(&this->mScreen);
      (*(pDVar6->super_DObject)._vptr_DObject[4])();
    }
    while( true ) {
      while (uVar1 = this->mIndex,
            uVar4 = TArray<FIntermissionAction_*,_FIntermissionAction_*>::Size
                              (&(this->mDesc->mActions).
                                super_TArray<FIntermissionAction_*,_FIntermissionAction_*>),
            uVar4 <= uVar1) {
        bVar3 = FName::operator!=(&this->mDesc->mLink,NAME_None);
        if (!bVar3) {
          return false;
        }
        FName::FName(&local_44,&this->mDesc->mLink);
        local_40 = TMap<FName,_FIntermissionDescriptor_*,_THashTraits<FName>,_TValueTraits<FIntermissionDescriptor_*>_>
                   ::CheckKey(&IntermissionDescriptors,&local_44);
        if (local_40 == (FIntermissionDescriptor **)0x0) {
          return false;
        }
        if (((this->mDeleteDesc & 1U) != 0) &&
           (this_00 = this->mDesc, this_00 != (FIntermissionDescriptor *)0x0)) {
          FIntermissionDescriptor::~FIntermissionDescriptor(this_00);
          operator_delete(this_00,0x18);
        }
        this->mDeleteDesc = false;
        this->mIndex = 0;
        this->mDesc = *local_40;
      }
      iVar2 = this->mIndex;
      this->mIndex = iVar2 + 1;
      ppFVar5 = TArray<FIntermissionAction_*,_FIntermissionAction_*>::operator[]
                          (&(this->mDesc->mActions).
                            super_TArray<FIntermissionAction_*,_FIntermissionAction_*>,(long)iVar2);
      local_30 = *ppFVar5;
      if (local_30->mClass != (PClass *)0xffffffffffffffff) break;
      wipegamestate = *(gamestate_t *)&local_30[1]._vptr_FIntermissionAction;
    }
    if (local_30->mClass == (PClass *)0xfffffffffffffffe) {
      (*(this->super_DObject)._vptr_DObject[4])();
      D_StartTitle();
      this_local._7_1_ = false;
    }
    else {
      pDVar6 = (DIntermissionScreen *)PClass::CreateNew(local_30->mClass);
      TObjPtr<DIntermissionScreen>::operator=(&this->mScreen,pDVar6);
      pDVar6 = TObjPtr<DIntermissionScreen>::operator->(&this->mScreen);
      pDesc._4_4_ = local_1c.texnum;
      DIntermissionScreen::SetBackground(pDVar6,local_1c,(bool)(local_1d & 1));
      pDVar6 = TObjPtr<DIntermissionScreen>::operator->(&this->mScreen);
      (*(pDVar6->super_DObject)._vptr_DObject[7])(pDVar6,local_30,(ulong)this->mFirst & 1);
      this->mFirst = false;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DIntermissionController::NextPage ()
{
	FTextureID bg;
	bool fill = false;

	if (mIndex == (int)mDesc->mActions.Size() && mDesc->mLink == NAME_None)
	{
		// last page
		return false;
	}

	if (mScreen != NULL)
	{
		bg = mScreen->GetBackground(&fill);
		mScreen->Destroy();
	}
again:
	while ((unsigned)mIndex < mDesc->mActions.Size())
	{
		FIntermissionAction *action = mDesc->mActions[mIndex++];
		if (action->mClass == WIPER_ID)
		{
			wipegamestate = static_cast<FIntermissionActionWiper*>(action)->mWipeType;
		}
		else if (action->mClass == TITLE_ID)
		{
			Destroy();
			D_StartTitle ();
			return false;
		}
		else
		{
			// create page here
			mScreen = (DIntermissionScreen*)action->mClass->CreateNew();
			mScreen->SetBackground(bg, fill);	// copy last screen's background before initializing
			mScreen->Init(action, mFirst);
			mFirst = false;
			return true;
		}
	}
	if (mDesc->mLink != NAME_None)
	{
		FIntermissionDescriptor **pDesc = IntermissionDescriptors.CheckKey(mDesc->mLink);
		if (pDesc != NULL)
		{
			if (mDeleteDesc) delete mDesc;
			mDeleteDesc = false;
			mIndex = 0;
			mDesc = *pDesc;
			goto again;
		}
	}
	return false;
}